

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

ostream * phyr::operator<<(ostream *os,Point3<double> *p)

{
  ostream *poVar1;
  
  std::operator<<(os,"[");
  poVar1 = std::ostream::_M_insert<double>(p->x);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(p->y);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(p->z);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const Point3<T>& p) {
    return (os << "[" << p.x << ", " << p.y << ", " << p.z << "]");
}